

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setAutoFillBackground(QWidget *this,bool enabled)

{
  bool bVar1;
  uint uVar2;
  pointer pQVar3;
  byte in_SIL;
  QWidgetPrivate *in_RDI;
  QWidgetPrivate *unaff_retaddr;
  QWidgetPrivate *d;
  undefined4 in_stack_ffffffffffffffd8;
  
  d_func((QWidget *)0x35b485);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b498);
  if (!bVar1) {
    QWidgetPrivate::createExtra(in_RDI);
  }
  pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b4b4);
  if ((*(ushort *)&pQVar3->field_0x7c >> 4 & 1) != (ushort)(in_SIL & 1)) {
    uVar2 = (uint)(in_SIL & 1);
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b4ee);
    *(ushort *)&pQVar3->field_0x7c =
         *(ushort *)&pQVar3->field_0x7c & 0xffef | ((ushort)uVar2 & 1) << 4;
    QWidgetPrivate::updateIsOpaque(unaff_retaddr);
    update((QWidget *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
    QWidgetPrivate::updateIsOpaque(unaff_retaddr);
  }
  return;
}

Assistant:

void QWidget::setAutoFillBackground(bool enabled)
{
    Q_D(QWidget);
    if (!d->extra)
        d->createExtra();
    if (d->extra->autoFillBackground == enabled)
        return;

    d->extra->autoFillBackground = enabled;
    d->updateIsOpaque();
    update();
    d->updateIsOpaque();
}